

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

Vec_Wec_t * Spl_ManToWecMapping(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = p->nObjs;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar1;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x49,"Vec_Wec_t *Spl_ManToWecMapping(Gia_Man_t *)");
  }
  if (1 < p->nObjs) {
    lVar11 = 1;
    do {
      if (p->vMapping->nSize <= lVar11) {
LAB_007d1fd2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[lVar11] != 0) {
        pVVar5 = p->vMapping;
        lVar6 = (long)pVVar5->nSize;
        if (lVar6 <= lVar11) goto LAB_007d1fd2;
        uVar8 = (int)lVar11 + 1;
        lVar10 = 0;
        while( true ) {
          piVar2 = pVVar5->pArray;
          lVar9 = (long)piVar2[lVar11];
          if ((lVar9 < 0) || ((int)lVar6 <= piVar2[lVar11])) goto LAB_007d1fd2;
          if (piVar2[lVar9] <= lVar10) break;
          iVar1 = piVar2[lVar9 + lVar10 + 1];
          if (pVVar4->nSize <= lVar11) {
            uVar3 = pVVar4->nSize * 2;
            if ((int)uVar3 <= (int)uVar8) {
              uVar3 = uVar8;
            }
            iVar7 = pVVar4->nCap;
            if (iVar7 < (int)uVar3) {
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar3 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
              }
              pVVar4->pArray = pVVar5;
              memset(pVVar5 + iVar7,0,(long)(int)(uVar3 - iVar7) << 4);
              pVVar4->nCap = uVar3;
            }
            pVVar4->nSize = uVar8;
          }
          if (pVVar4->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(pVVar4->pArray + lVar11,iVar1);
          lVar10 = lVar10 + 1;
          pVVar5 = p->vMapping;
          lVar6 = (long)pVVar5->nSize;
          if (lVar6 <= lVar11) goto LAB_007d1fd2;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < p->nObjs);
  }
  return pVVar4;
}

Assistant:

Vec_Wec_t * Spl_ManToWecMapping( Gia_Man_t * p )
{
    Vec_Wec_t * vMapping = Vec_WecStart( Gia_ManObjNum(p) );
    int Obj, Fanin, k;
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, Obj )
        Gia_LutForEachFanin( p, Obj, Fanin, k )
            Vec_WecPush( vMapping, Obj, Fanin );
    return vMapping;
}